

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<DifferenceFormatter>::
Unser<DataStream,std::vector<unsigned_short,std::allocator<unsigned_short>>>
          (VectorFormatter<DifferenceFormatter> *this,DataStream *s,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *v)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_RDX;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_RSI;
  long in_FS_OFFSET;
  size_t allocated;
  size_t size;
  DifferenceFormatter formatter;
  bool in_stack_00000047;
  DataStream *in_stack_00000048;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffffb8;
  unsigned_long *puVar3;
  size_type in_stack_fffffffffffffff0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_00;
  
  this_00 = *(vector<unsigned_short,_std::allocator<unsigned_short>_> **)(in_FS_OFFSET + 0x28);
  DifferenceFormatter::DifferenceFormatter((DifferenceFormatter *)in_stack_ffffffffffffffb8);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear(in_stack_ffffffffffffffb8);
  puVar1 = (unsigned_long *)ReadCompactSize<DataStream>(in_stack_00000048,in_stack_00000047);
  puVar3 = (unsigned_long *)0x0;
  while (puVar3 < puVar1) {
    puVar3 = std::min<unsigned_long>(puVar3,(unsigned_long *)in_stack_ffffffffffffffb8);
    puVar3 = (unsigned_long *)*puVar3;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
              (this_00,in_stack_fffffffffffffff0);
    while (puVar2 = (unsigned_long *)
                    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                              (in_stack_ffffffffffffffb8), puVar2 < puVar3) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<>(in_RDX);
      in_stack_ffffffffffffffb8 = in_RSI;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::back(in_RSI);
      DifferenceFormatter::Unser<DataStream,unsigned_short>
                ((DifferenceFormatter *)s,(DataStream *)v,(unsigned_short *)allocated);
    }
  }
  if (*(vector<unsigned_short,_std::allocator<unsigned_short>_> **)(in_FS_OFFSET + 0x28) != this_00)
  {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }